

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O0

void __thiscall xe::TestLogParser::~TestLogParser(TestLogParser *this)

{
  TestLogParser *this_local;
  
  de::SharedPtr<xe::TestCaseResultData>::~SharedPtr(&this->m_currentCaseData);
  SessionInfo::~SessionInfo(&this->m_sessionInfo);
  ContainerFormatParser::~ContainerFormatParser(&this->m_containerParser);
  return;
}

Assistant:

TestLogParser::~TestLogParser (void)
{
}